

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerHLSL::emit_mesh_tasks(CompilerHLSL *this,SPIRBlock *block)

{
  CompilerError *this_00;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if ((block->mesh).payload.id != 0) {
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_78,&this->super_CompilerGLSL,(block->mesh).groups[0].id,true);
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_98,&this->super_CompilerGLSL,(block->mesh).groups[1].id,true);
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_38,&this->super_CompilerGLSL,(block->mesh).groups[2].id,true);
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_58,&this->super_CompilerGLSL,(block->mesh).payload.id,true);
    CompilerGLSL::
    statement<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [14])"DispatchMesh(",&local_78,
               (char (*) [3])0x305b66,&local_98,(char (*) [3])0x305b66,&local_38,
               (char (*) [3])0x305b66,&local_58,(char (*) [3])0x313c4f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    return;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(this_00,"Amplification shader in HLSL must have payload");
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerHLSL::emit_mesh_tasks(SPIRBlock &block)
{
	if (block.mesh.payload != 0)
	{
		statement("DispatchMesh(", to_unpacked_expression(block.mesh.groups[0]), ", ", to_unpacked_expression(block.mesh.groups[1]), ", ",
		    to_unpacked_expression(block.mesh.groups[2]), ", ", to_unpacked_expression(block.mesh.payload), ");");
	}
	else
	{
		SPIRV_CROSS_THROW("Amplification shader in HLSL must have payload");
	}
}